

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool __thiscall AnyType::OutputFromType<OctetString>(AnyType *this,ostream *os)

{
  bool bVar1;
  undefined1 local_40 [7];
  bool fConverted;
  OctetString t;
  ostream *os_local;
  AnyType *this_local;
  
  t.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)os;
  OctetString::OctetString((OctetString *)local_40);
  bVar1 = ConvertToType<OctetString>(this,(OctetString *)local_40);
  if (bVar1) {
    ::operator<<((ostream *)
                 t.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(OctetString *)local_40);
  }
  OctetString::~OctetString((OctetString *)local_40);
  return bVar1;
}

Assistant:

bool OutputFromType(std::ostream& os) const 
    {
        T t;
        bool fConverted = ConvertToType(t);
        if (fConverted)
            os << t;

        return fConverted;
    }